

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

CLdispatchX * __thiscall CLIntercept::dispatchX(CLIntercept *this,cl_platform_id platform)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RSI;
  map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
  *in_RDI;
  const_iterator iter;
  _Self local_28;
  _Self local_20;
  map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
  *this_00;
  mapped_type *local_8;
  
  this_00 = in_RDI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
       ::find(in_RDI,(key_type *)0x193338);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>::
             operator->((_Rb_tree_const_iterator<std::pair<_cl_platform_id_*const,_CLdispatchX>_> *)
                        0x193371);
    local_8 = &ppVar2->second;
  }
  else {
    local_8 = std::
              map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
              ::at(this_00,in_RSI);
  }
  return local_8;
}

Assistant:

inline const CLdispatchX& CLIntercept::dispatchX( cl_platform_id platform ) const
{
    CLdispatchXMap::const_iterator iter = m_DispatchX.find(platform);
    if( iter != m_DispatchX.end() )
    {
        return iter->second;
    }
    else
    {
        return m_DispatchX.at(NULL);
    }
}